

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O0

int32_t ubidi_getMaxValue_63(UProperty which)

{
  int32_t max;
  UProperty which_local;
  
  switch(which) {
  case UCHAR_BIDI_CLASS:
    max = 0x16;
    break;
  default:
    max = -1;
    break;
  case UCHAR_JOINING_GROUP:
    max = 0x65;
    break;
  case UCHAR_JOINING_TYPE:
    max = 5;
    break;
  case UCHAR_BIDI_PAIRED_BRACKET_TYPE:
    max = 2;
  }
  return max;
}

Assistant:

U_CFUNC int32_t
ubidi_getMaxValue(UProperty which) {
    int32_t max=ubidi_props_singleton.indexes[UBIDI_MAX_VALUES_INDEX];
    switch(which) {
    case UCHAR_BIDI_CLASS:
        return (max&UBIDI_CLASS_MASK);
    case UCHAR_JOINING_GROUP:
        return (max&UBIDI_MAX_JG_MASK)>>UBIDI_MAX_JG_SHIFT;
    case UCHAR_JOINING_TYPE:
        return (max&UBIDI_JT_MASK)>>UBIDI_JT_SHIFT;
    case UCHAR_BIDI_PAIRED_BRACKET_TYPE:
        return (max&UBIDI_BPT_MASK)>>UBIDI_BPT_SHIFT;
    default:
        return -1; /* undefined */
    }
}